

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::opTypeCast(PrintC *this,PcodeOp *op)

{
  Varnode *pVVar1;
  HighVariable *this_00;
  PcodeOp *op_local;
  PrintC *this_local;
  
  if (((this->super_PrintLanguage).field_0xff & 1) == 0) {
    PrintLanguage::pushOp(&this->super_PrintLanguage,&typecast,op);
    pVVar1 = PcodeOp::getOut(op);
    this_00 = Varnode::getHigh(pVVar1);
    HighVariable::getType(this_00);
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[1])();
  }
  pVVar1 = PcodeOp::getIn(op,0);
  PrintLanguage::pushVnImplied
            (&this->super_PrintLanguage,pVVar1,op,(this->super_PrintLanguage).mods);
  return;
}

Assistant:

void PrintC::opTypeCast(const PcodeOp *op)

{
  if (!option_nocasts) {
    pushOp(&typecast,op);
    pushType(op->getOut()->getHigh()->getType());
  }
  pushVnImplied(op->getIn(0),op,mods);
}